

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<short,_int,_5>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *t,int *u,short *result)

{
  short sVar1;
  short sVar2;
  undefined2 *in_RDX;
  int *in_RSI;
  short *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*in_RDI == 0) {
    *in_RDX = 0;
  }
  else {
    sVar1 = *in_RDI;
    sVar2 = std::numeric_limits<short>::min();
    if ((sVar1 == sVar2) && (*in_RSI == -1)) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = (short)((int)*in_RDI / *in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }